

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::postscriptFunc(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *this_01;
  RefAST RVar1;
  int iVar2;
  NoViableAltException *this_02;
  RefAST tmp124_AST;
  RefAST tmp121_AST;
  RefAST tmp120_AST;
  RefAST tmp119_AST;
  RefCount<AST> local_a0;
  RefCount<Token> local_98;
  RefCount<Token> local_90;
  RefCount<Token> local_88;
  RefCount<Token> local_80;
  ASTPair currentAST;
  RefCount<AST> local_60;
  RefToken local_58;
  RefAST local_50;
  RefAST local_48;
  RefCount<Token> local_40;
  RefCount<Token> local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_a0.ref = nullAST.ref;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 2;
  }
  tmp119_AST.ref = local_a0.ref;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
  this_01 = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)&tmp120_AST,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp119_AST,&tmp120_AST);
  RefCount<AST>::~RefCount(&tmp120_AST);
  RefCount<Token>::~RefCount(&local_80);
  if (tmp119_AST.ref != (Ref *)0x0) {
    (tmp119_AST.ref)->count = (tmp119_AST.ref)->count + 1;
  }
  local_48.ref = tmp119_AST.ref;
  ASTFactory::makeASTRoot(this_01,&currentAST,&local_48);
  RefCount<AST>::~RefCount(&local_48);
  Parser::match((Parser *)this,0x1e);
  tmp120_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
  ASTFactory::create((ASTFactory *)&tmp121_AST,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp120_AST,&tmp121_AST);
  RefCount<AST>::~RefCount(&tmp121_AST);
  RefCount<Token>::~RefCount(&local_88);
  Parser::match((Parser *)this,6);
  tmp121_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90,this,1);
  ASTFactory::create((ASTFactory *)&tmp124_AST,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp121_AST,&tmp124_AST);
  RefCount<AST>::~RefCount(&tmp124_AST);
  RefCount<Token>::~RefCount(&local_90);
  if (tmp121_AST.ref != (Ref *)0x0) {
    (tmp121_AST.ref)->count = (tmp121_AST.ref)->count + 1;
  }
  local_50.ref = tmp121_AST.ref;
  ASTFactory::addASTChild(this_01,&currentAST,&local_50);
  RefCount<AST>::~RefCount(&local_50);
  Parser::match((Parser *)this,0x14);
  do {
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar2 != 0x14) {
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      RVar1 = nullAST;
      if (iVar2 != 0x15) {
        if (nullAST.ref != (Ref *)0x0) {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        tmp124_AST = RVar1;
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
        ASTFactory::create((ASTFactory *)&stack0xffffffffffffff50,(RefToken *)this_01);
        RefCount<AST>::operator=(&tmp124_AST,(RefCount<AST> *)&stack0xffffffffffffff50);
        RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff50);
        RefCount<Token>::~RefCount(&local_98);
        Parser::match((Parser *)this,7);
        RefCount<AST>::operator=(&local_a0,&currentAST.root);
        RefCount<AST>::~RefCount(&tmp124_AST);
        RefCount<AST>::~RefCount(&tmp121_AST);
        RefCount<AST>::~RefCount(&tmp120_AST);
        RefCount<AST>::~RefCount(&tmp119_AST);
        RefCount<AST>::operator=(this_00,&local_a0);
        RefCount<AST>::~RefCount(&local_a0);
        ASTPair::~ASTPair(&currentAST);
        return;
      }
    }
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    RVar1 = nullAST;
    if (iVar2 != 0x14) {
      if (iVar2 != 0x15) {
        this_02 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_58,this,1);
        NoViableAltException::NoViableAltException(this_02,&local_58);
        __cxa_throw(this_02,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      tmp124_AST = RVar1;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_38,this,1);
      ASTFactory::create((ASTFactory *)&stack0xffffffffffffff50,(RefToken *)this_01);
      RefCount<AST>::operator=(&tmp124_AST,(RefCount<AST> *)&stack0xffffffffffffff50);
      RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff50);
      RefCount<Token>::~RefCount(&local_38);
      Parser::match((Parser *)this,0x15);
      RefCount<AST>::~RefCount(&tmp124_AST);
    }
    tmp124_AST.ref = nullAST.ref;
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40,this,1);
    ASTFactory::create((ASTFactory *)&stack0xffffffffffffff50,(RefToken *)this_01);
    RefCount<AST>::operator=(&tmp124_AST,(RefCount<AST> *)&stack0xffffffffffffff50);
    RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff50);
    RefCount<Token>::~RefCount(&local_40);
    if (tmp124_AST.ref != (Ref *)0x0) {
      (tmp124_AST.ref)->count = (tmp124_AST.ref)->count + 1;
    }
    local_60.ref = tmp124_AST.ref;
    ASTFactory::addASTChild(this_01,&currentAST,&local_60);
    RefCount<AST>::~RefCount(&local_60);
    Parser::match((Parser *)this,0x14);
    RefCount<AST>::~RefCount(&tmp124_AST);
  } while( true );
}

Assistant:

void GrpParser::postscriptFunc() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST postscriptFunc_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp119_AST = nullAST;
		tmp119_AST = astFactory.create(LT(1));
		astFactory.makeASTRoot(currentAST, tmp119_AST);
		match(LITERAL_postscript);
		RefAST tmp120_AST = nullAST;
		tmp120_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		RefAST tmp121_AST = nullAST;
		tmp121_AST = astFactory.create(LT(1));
		astFactory.addASTChild(currentAST, tmp121_AST);
		match(LIT_STRING);
		{
		do {
			if ((LA(1)==LIT_STRING||LA(1)==OP_COMMA)) {
				{
				switch ( LA(1)) {
				case OP_COMMA:
				{
					RefAST tmp122_AST = nullAST;
					tmp122_AST = astFactory.create(LT(1));
					match(OP_COMMA);
					break;
				}
				case LIT_STRING:
				{
					break;
				}
				default:
				{
					throw NoViableAltException(LT(1));
				}
				}
				}
				RefAST tmp123_AST = nullAST;
				tmp123_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp123_AST);
				match(LIT_STRING);
			}
			else {
				goto _loop111;
			}
			
		} while (true);
		_loop111:;
		}
		RefAST tmp124_AST = nullAST;
		tmp124_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		postscriptFunc_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_35);
	}
	returnAST = postscriptFunc_AST;
}